

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeDee.cpp
# Opt level: O0

void TeeDee::CalcPattern(Data *data)

{
  uint uVar1;
  uint local_1c;
  Random local_18;
  int i;
  Random random;
  int seed;
  Data *data_local;
  
  i = (int)data->p[0];
  _random = data;
  Random::Seed(&local_18,(long)(i * 1000));
  for (local_1c = 0; (int)local_1c < 0x40; local_1c = local_1c + 1) {
    switch(i) {
    case 0:
      _random->pattern[(int)local_1c] = (uint)((local_1c & 3) == 0);
      break;
    case 1:
      _random->pattern[(int)local_1c] = (uint)((local_1c & 7) == 4);
      break;
    case 2:
      _random->pattern[(int)local_1c] = (uint)((local_1c & 7) < 2);
      break;
    case 3:
      _random->pattern[(int)local_1c] = (uint)((local_1c & 7) == 0xc);
      break;
    case 4:
      _random->pattern[(int)local_1c] = 1;
      break;
    default:
      uVar1 = Random::Get(&local_18);
      _random->pattern[(int)local_1c] = uVar1 & 1;
    }
  }
  return;
}

Assistant:

static void CalcPattern(EffectData::Data* data)
    {
        int seed = (int)data->p[P_SEED];
        Random random;
        random.Seed((unsigned long)(seed * 1000));
        for (int i = 0; i < 64; i++)
        {
            switch (seed)
            {
                case 0: data->pattern[i] = ((i & 3) ==  0) ? 1 : 0; break;
                case 1: data->pattern[i] = ((i & 7) ==  4) ? 1 : 0; break;
                case 2: data->pattern[i] = ((i & 7) <   2) ? 1 : 0; break;
                case 3: data->pattern[i] = ((i & 7) == 12) ? 1 : 0; break;
                case 4: data->pattern[i] = 1; break;
                default: data->pattern[i] = random.Get() & 1;
            }
        }
    }